

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializable.cpp
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* blc::tools::serializable::cut(string *str,char cut)

{
  char in_DL;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string after;
  string before;
  int i;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  string local_58 [32];
  string local_38 [32];
  int local_18;
  ulong local_10;
  
  __args = in_RDI;
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::find((char)in_RSI,(ulong)(uint)(int)in_DL);
  std::__cxx11::string::substr((ulong)local_38,local_10);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_58,local_10);
  if (local_18 == -1) {
    std::make_tuple<std::__cxx11::string_const&,char_const(&)[1]>(__args,(char (*) [1])in_RDI);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_true>
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI,in_stack_ffffffffffffff38);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
              *)0x11f38f);
  }
  else {
    std::make_tuple<std::__cxx11::string&,std::__cxx11::string&>(__args,in_RDI);
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)__args;
}

Assistant:

std::tuple<std::string, std::string> blc::tools::serializable::cut(const std::string &str, char cut) {
	int 		i = str.find(cut);
	std::string	before = str.substr(0, i);
	std::string	after = str.substr(i + 1, str.size());

	if (i == -1)
		return (std::make_tuple(str, ""));
	return (std::make_tuple(before, after));
}